

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void codecomp(FuncState *fs,BinOpr opr,expdesc *e1,expdesc *e2)

{
  int iVar1;
  uint local_3c;
  OpCode op_1;
  OpCode op;
  int rk2;
  int rk1;
  expdesc *e2_local;
  expdesc *e1_local;
  BinOpr opr_local;
  FuncState *fs_local;
  
  if (e1->k == VK) {
    local_3c = (e1->u).info | 0x100;
  }
  else {
    local_3c = (e1->u).info;
  }
  iVar1 = luaK_exp2RK(fs,e2);
  freeexps(fs,e1,e2);
  if (opr == OPR_NE) {
    iVar1 = condjump(fs,OP_EQ,0,local_3c,iVar1);
    (e1->u).info = iVar1;
  }
  else if (opr - OPR_GT < 2) {
    iVar1 = condjump(fs,opr + OPR_LE,1,iVar1,local_3c);
    (e1->u).info = iVar1;
  }
  else {
    iVar1 = condjump(fs,opr + OPR_GE,1,local_3c,iVar1);
    (e1->u).info = iVar1;
  }
  e1->k = VJMP;
  return;
}

Assistant:

static void codecomp (FuncState *fs, BinOpr opr, expdesc *e1, expdesc *e2) {
  int rk1 = (e1->k == VK) ? RKASK(e1->u.info)
                          : check_exp(e1->k == VNONRELOC, e1->u.info);
  int rk2 = luaK_exp2RK(fs, e2);
  freeexps(fs, e1, e2);
  switch (opr) {
    case OPR_NE: {  /* '(a ~= b)' ==> 'not (a == b)' */
      e1->u.info = condjump(fs, OP_EQ, 0, rk1, rk2);
      break;
    }
    case OPR_GT: case OPR_GE: {
      /* '(a > b)' ==> '(b < a)';  '(a >= b)' ==> '(b <= a)' */
      OpCode op = cast(OpCode, (opr - OPR_NE) + OP_EQ);
      e1->u.info = condjump(fs, op, 1, rk2, rk1);  /* invert operands */
      break;
    }
    default: {  /* '==', '<', '<=' use their own opcodes */
      OpCode op = cast(OpCode, (opr - OPR_EQ) + OP_EQ);
      e1->u.info = condjump(fs, op, 1, rk1, rk2);
      break;
    }
  }
  e1->k = VJMP;
}